

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O2

int wsio_send(CONCRETE_IO_HANDLE ws_io,void *buffer,size_t size,ON_SEND_COMPLETE on_send_complete,
             void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *item;
  LIST_ITEM_HANDLE item_00;
  WSIO_INSTANCE *wsio_instance;
  
  if ((buffer == (void *)0x0 || ws_io == (CONCRETE_IO_HANDLE)0x0) || size == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x23d;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                ,"wsio_send",0x23c,1,"Bad arguments: ws_io=%p, buffer=%p, size=%u",ws_io,buffer,size
               );
    }
  }
  else if (*(int *)((long)ws_io + 0x40) == 2) {
    item = (undefined8 *)malloc(0x18);
    if (item == (undefined8 *)0x0) {
      iVar1 = 0x250;
    }
    else {
      *item = on_send_complete;
      item[1] = callback_context;
      item[2] = ws_io;
      item_00 = singlylinkedlist_add(*(SINGLYLINKEDLIST_HANDLE *)((long)ws_io + 0x48),item);
      if (item_00 == (LIST_ITEM_HANDLE)0x0) {
        free(item);
        iVar1 = 0x25e;
      }
      else {
        iVar1 = uws_client_send_frame_async
                          (*(UWS_CLIENT_HANDLE *)((long)ws_io + 0x50),'\x02',(uchar *)buffer,size,
                           true,on_underlying_ws_send_frame_complete,item_00);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = singlylinkedlist_remove(*(SINGLYLINKEDLIST_HANDLE *)((long)ws_io + 0x48),item_00);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                        ,"wsio_send",0x269,1,"Failed removing pending IO from linked list.");
            }
          }
          free(item);
          iVar1 = 0x26d;
        }
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x247;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                ,"wsio_send",0x246,1,"Attempting to send when not open");
    }
  }
  return iVar1;
}

Assistant:

int wsio_send(CONCRETE_IO_HANDLE ws_io, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    /* Codes_SRS_WSIO_01_100: [ If any of the arguments ws_io or buffer are NULL, wsio_send shall fail and return a non-zero value. ]*/
    if ((ws_io == NULL) ||
        (buffer == NULL) ||
        /* Codes_SRS_WSIO_01_101: [ If size is zero then wsio_send shall fail and return a non-zero value. ]*/
        (size == 0))
    {
        LogError("Bad arguments: ws_io=%p, buffer=%p, size=%u",
            ws_io, buffer, (unsigned int)size);
        result = MU_FAILURE;
    }
    else
    {
        WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)ws_io;

        if (wsio_instance->io_state != IO_STATE_OPEN)
        {
            /* Codes_SRS_WSIO_01_099: [ If the wsio is not OPEN (open has not been called or is still in progress) then wsio_send shall fail and return a non-zero value. ]*/
            LogError("Attempting to send when not open");
            result = MU_FAILURE;
        }
        else
        {
            LIST_ITEM_HANDLE new_item;
            PENDING_IO* pending_socket_io = (PENDING_IO*)malloc(sizeof(PENDING_IO));
            if (pending_socket_io == NULL)
            {
                /* Codes_SRS_WSIO_01_134: [ If allocating memory for the pending IO data fails, wsio_send shall fail and return a non-zero value. ]*/
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_WSIO_01_103: [ The entry shall contain the on_send_complete callback and its context. ]*/
                pending_socket_io->on_send_complete = on_send_complete;
                pending_socket_io->callback_context = callback_context;
                pending_socket_io->wsio = wsio_instance;

                /* Codes_SRS_WSIO_01_102: [ An entry shall be queued in the singly linked list by calling singlylinkedlist_add. ]*/
                if ((new_item = singlylinkedlist_add(wsio_instance->pending_io_list, pending_socket_io)) == NULL)
                {
                    /* Codes_SRS_WSIO_01_104: [ If singlylinkedlist_add fails, wsio_send shall fail and return a non-zero value. ]*/
                    free(pending_socket_io);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_WSIO_01_095: [ wsio_send shall call uws_client_send_frame_async, passing the buffer and size arguments as they are: ]*/
                    /* Codes_SRS_WSIO_01_097: [ The is_final argument shall be set to true. ]*/
                    /* Codes_SRS_WSIO_01_096: [ The frame type used shall be WS_FRAME_TYPE_BINARY. ]*/
                    if (uws_client_send_frame_async(wsio_instance->uws, WS_FRAME_TYPE_BINARY, (const unsigned char*)buffer, size, true, on_underlying_ws_send_frame_complete, new_item) != 0)
                    {
                        if (singlylinkedlist_remove(wsio_instance->pending_io_list, new_item) != 0)
                        {
                            LogError("Failed removing pending IO from linked list.");
                        }

                        free(pending_socket_io);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        /* Codes_SRS_WSIO_01_098: [ On success, wsio_send shall return 0. ]*/
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}